

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::PALCS_DumpCSList(void)

{
  BOOL BVar1;
  _PAL_CRITICAL_SECTION *p_Var2;
  _PAL_CRITICAL_SECTION *p_Var3;
  SIZE_T SVar4;
  HANDLE pVVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  PalCsInitState PVar10;
  CPalThread *pThread_00;
  PPAL_CRITICAL_SECTION pCS;
  PCRITICAL_SECTION_DEBUG_INFO pDebugInfo;
  PLIST_ENTRY pItem;
  CPalThread *pThread;
  
  pThread_00 = InternalGetCurrentThread();
  InternalEnterCriticalSection(pThread_00,(PCRITICAL_SECTION)g_csPALCSsListLock);
  for (pDebugInfo = (PCRITICAL_SECTION_DEBUG_INFO)g_PALCSList;
      pDebugInfo != (PCRITICAL_SECTION_DEBUG_INFO)&g_PALCSList;
      pDebugInfo = (PCRITICAL_SECTION_DEBUG_INFO)(pDebugInfo->Link).Flink) {
    p_Var2 = pDebugInfo->pOwnerCS;
    printf("CS @ %p \n{\tDebugInfo = %p -> \n",p_Var2,pDebugInfo);
    p_Var3 = pDebugInfo->pOwnerCS;
    uVar7 = Volatile<unsigned_int>::Load(&pDebugInfo->lAcquireCount);
    uVar8 = Volatile<unsigned_int>::Load(&pDebugInfo->lEnterCount);
    uVar9 = Volatile<int>::Load(&pDebugInfo->lContentionCount);
    printf("\t{\n\t\t[Link]\n\t\tpOwnerCS = %p\n\t\tAcquireCount \t= %d\n\t\tEnterCount \t= %d\n\t\tContentionCount = %d\n"
           ,p_Var3,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
    printf("\t}\n");
    uVar8 = Volatile<int>::Load(&p_Var2->LockCount);
    uVar7 = p_Var2->RecursionCount;
    SVar4 = p_Var2->OwningThread;
    pVVar5 = p_Var2->LockSemaphore;
    uVar6 = p_Var2->SpinCount;
    BVar1 = p_Var2->fInternal;
    PVar10 = Volatile<PalCsInitState>::Load(&p_Var2->cisInitState);
    printf("\tLockCount \t= %#x\n\tRecursionCount \t= %d\n\tOwningThread \t= %p\n\tLockSemaphore \t= %p\n\tSpinCount \t= %u\n\tfInternal \t= %d\n\teInitState \t= %u\n\tpNativeData \t= %p ->\n"
           ,(ulong)uVar8,(ulong)uVar7,SVar4,pVVar5,uVar6 & 0xffffffff,BVar1,PVar10,
           &p_Var2->csndNativeData);
    printf("\t{\n\t\t[mutex]\n\t\t[condition]\n\t\tPredicate \t= %d\n\t}\n}\n",
           (ulong)(uint)(p_Var2->csndNativeData).iPredicate);
    printf("}\n");
  }
  InternalLeaveCriticalSection(pThread_00,(PCRITICAL_SECTION)g_csPALCSsListLock);
  return;
}

Assistant:

void PALCS_DumpCSList()
    {
        CPalThread * pThread = InternalGetCurrentThread();

        // Take the lock for the global list of CS debug infos
        InternalEnterCriticalSection(pThread, (CRITICAL_SECTION*)&g_csPALCSsListLock);

        PLIST_ENTRY pItem = g_PALCSList.Flink;
        while (&g_PALCSList != pItem)
        {
            PCRITICAL_SECTION_DEBUG_INFO pDebugInfo =
                (PCRITICAL_SECTION_DEBUG_INFO)pItem;
            PPAL_CRITICAL_SECTION pCS = pDebugInfo->pOwnerCS;

            printf("CS @ %p \n"
                   "{\tDebugInfo = %p -> \n",
                   pCS, pDebugInfo);

            printf("\t{\n\t\t[Link]\n\t\tpOwnerCS = %p\n"
                   "\t\tAcquireCount \t= %d\n"
                   "\t\tEnterCount \t= %d\n"
                   "\t\tContentionCount = %d\n",
                   pDebugInfo->pOwnerCS, pDebugInfo->lAcquireCount.Load(),
                   pDebugInfo->lEnterCount.Load(), pDebugInfo->lContentionCount.Load());
            printf("\t}\n");

            printf("\tLockCount \t= %#x\n"
                   "\tRecursionCount \t= %d\n"
                   "\tOwningThread \t= %p\n"
                   "\tLockSemaphore \t= %p\n"
                   "\tSpinCount \t= %u\n"
                   "\tfInternal \t= %d\n"
                   "\teInitState \t= %u\n"
                   "\tpNativeData \t= %p ->\n",
                   pCS->LockCount.Load(), pCS->RecursionCount, (void *)pCS->OwningThread,
                   pCS->LockSemaphore, (unsigned)pCS->SpinCount, (int)pCS->fInternal,
                   pCS->cisInitState.Load(), &pCS->csndNativeData);

            printf("\t{\n\t\t[mutex]\n\t\t[condition]\n"
                   "\t\tPredicate \t= %d\n"
                   "\t}\n}\n",pCS->csndNativeData.iPredicate);

            printf("}\n");

            pItem = pItem->Flink;
        }

        // Release the lock for the global list of CS debug infos
        InternalLeaveCriticalSection(pThread, (CRITICAL_SECTION*)&g_csPALCSsListLock);
    }